

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::copyPointer
          (SegmentBuilder *dstSegment,CapTableBuilder *dstCapTable,WirePointer *dst,
          SegmentReader *srcSegment,CapTableReader *srcCapTable,WirePointer *src,word *srcTarget,
          int nestingLimit,BuilderArena *orphanArena,bool canonical)

{
  ushort uVar1;
  ushort uVar2;
  Arena *pAVar3;
  ulong uVar4;
  ReadLimiter *pRVar5;
  StructReader value;
  ListReader value_00;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  uint uVar8;
  SegmentReader *pSVar9;
  word *pwVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  char *condition;
  ulong uVar15;
  uint uVar16;
  WirePointer *pWVar17;
  SegmentAnd<capnp::word_*> SVar18;
  undefined4 uVar19;
  Fault f;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_ac;
  undefined4 uStack_a4;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_7c;
  undefined4 uStack_74;
  undefined2 uStack_4a;
  undefined4 uStack_44;
  Fault f_8;
  ClientHook *local_38;
  
  uVar8 = (src->offsetAndKind).value;
  if ((src->field_1).upper32Bits != 0 || uVar8 != 0) {
    uVar19 = (undefined4)((ulong)srcCapTable >> 0x20);
    if (srcSegment == (SegmentReader *)0x0) {
      srcSegment = (SegmentReader *)0x0;
LAB_0019b7a7:
      pWVar17 = src;
      if ((WirePointer *)srcTarget == (WirePointer *)0x0) goto LAB_0019bbfd;
LAB_0019b7b3:
      uVar8 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
      switch(uVar8 & 3) {
      case 0:
switchD_0019b754_caseD_0:
        if (nestingLimit < 1) {
          iVar6 = 0x7a1;
LAB_0019bd3e:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[76]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar6,FAILED,"nestingLimit > 0",
                     "\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                     ,(char (*) [76])
                      "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.")
          ;
        }
        else {
          uVar1 = *(ushort *)&pWVar17->field_1;
          uVar2 = *(ushort *)((long)&pWVar17->field_1 + 2);
          if (srcSegment == (SegmentReader *)0x0) {
LAB_0019b81e:
            value.capTable._0_4_ = (int)srcCapTable;
            value.segment = srcSegment;
            value.capTable._4_4_ = uVar19;
            value.data._0_4_ = (int)srcTarget;
            value.data._4_4_ = (int)((ulong)srcTarget >> 0x20);
            value.pointers._0_4_ = (int)((WirePointer *)srcTarget + uVar1);
            value.pointers._4_4_ = (int)((ulong)((WirePointer *)srcTarget + uVar1) >> 0x20);
            value.dataSize = (uint)uVar1 << 6;
            value._36_4_ = (int)(CONCAT26(uStack_4a,CONCAT24(uVar2,(uint)uVar1 << 6)) >> 0x20);
            value.nestingLimit = nestingLimit + -1;
            value._44_4_ = uStack_44;
            SVar18 = setStructPointer(dstSegment,dstCapTable,dst,value,orphanArena,canonical);
LAB_0019bba7:
            pwVar10 = SVar18.value;
            dstSegment = SVar18.segment;
            goto LAB_0019bc1c;
          }
          uVar14 = (ulong)uVar2 + (ulong)uVar1;
          if (((long)srcTarget - (long)(srcSegment->ptr).ptr >> 3) + uVar14 <=
              (srcSegment->ptr).size_) {
            uVar7 = srcSegment->readLimiter->limit;
            if (uVar14 <= uVar7) {
              srcSegment->readLimiter->limit = uVar7 - uVar14;
              goto LAB_0019b81e;
            }
            (*srcSegment->arena->_vptr_Arena[3])();
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x7a6,FAILED,"boundsCheck(srcSegment, ptr, src->structRef.wordSize())",
                     "\"Message contained out-of-bounds struct pointer.\"",
                     (char (*) [48])"Message contained out-of-bounds struct pointer.");
        }
        break;
      case 1:
switchD_0019b754_caseD_1:
        if (nestingLimit < 1) {
          iVar6 = 0x7b5;
          goto LAB_0019bd3e;
        }
        uVar8 = (pWVar17->field_1).upper32Bits;
        bVar11 = (byte)uVar8 & 7;
        if (bVar11 == 7) {
          uVar8 = uVar8 >> 3;
          if (srcSegment == (SegmentReader *)0x0) {
LAB_0019b9da:
            uVar12 = (uint)*(uint64_t *)&(((WirePointer *)srcTarget)->offsetAndKind).value;
            if ((uVar12 & 3) == 0) {
              uVar12 = uVar12 >> 2 & 0x1fffffff;
              uVar14 = (ulong)uVar12;
              uVar1 = *(ushort *)&((WirePointer *)srcTarget)->field_1;
              uVar2 = *(ushort *)((long)&((WirePointer *)srcTarget)->field_1 + 2);
              uVar16 = (uint)uVar2 + (uint)uVar1;
              if (uVar16 * uVar14 < (ulong)uVar8 || uVar16 * uVar14 - (ulong)uVar8 == 0) {
                pSVar9 = (SegmentReader *)0x0;
                if (uVar16 != 0) {
                  pSVar9 = srcSegment;
                }
                if ((srcSegment != (SegmentReader *)0x0) && (uVar16 == 0)) {
                  uVar7 = srcSegment->readLimiter->limit;
                  if (uVar7 < uVar14) {
                    (*srcSegment->arena->_vptr_Arena[3])();
                    iVar6 = 0x7d5;
LAB_0019bf49:
                    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                              (&f,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                               ,iVar6,FAILED,
                               "amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS))",
                               "\"Message contains amplified list pointer.\"",
                               (char (*) [41])"Message contains amplified list pointer.");
                    break;
                  }
                  srcSegment->readLimiter->limit = uVar7 - uVar14;
                  pSVar9 = srcSegment;
                }
                srcTarget = (word *)((WirePointer *)srcTarget + 1);
                uVar16 = uVar16 * 0x40;
                iVar6 = (uint)uVar1 << 6;
                uStack_7c._0_3_ = CONCAT12(7,uVar2);
                local_a0 = SUB84(pSVar9,0);
                uStack_9c = (undefined4)((ulong)pSVar9 >> 0x20);
LAB_0019bb7d:
                value_00.segment._4_4_ = uStack_9c;
                value_00.segment._0_4_ = local_a0;
                value_00.capTable._0_4_ = (int)srcCapTable;
                value_00.capTable._4_4_ = uVar19;
                value_00.ptr._0_4_ = (int)srcTarget;
                value_00.ptr._4_4_ = (int)((ulong)srcTarget >> 0x20);
                value_00.elementCount = uVar12;
                value_00.step = uVar16;
                value_00.structDataSize = iVar6;
                value_00.structPointerCount = (short)uStack_7c;
                value_00.elementSize = (char)(uStack_7c >> 0x10);
                value_00._39_1_ = (char)(uStack_7c >> 0x18);
                value_00.nestingLimit = nestingLimit + -1;
                value_00._44_4_ = uStack_74;
                SVar18 = setListPointer(dstSegment,dstCapTable,dst,value_00,orphanArena,canonical);
                goto LAB_0019bba7;
              }
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57]>
                        (&f,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x7cd,FAILED,
                         "wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount",
                         "\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                         (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.")
              ;
            }
            else {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                        (&f,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x7c5,FAILED,"tag->kind() == WirePointer::STRUCT",
                         "\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\"",
                         (char (*) [61])
                         "INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
            }
            break;
          }
          if (((long)srcTarget - (long)(srcSegment->ptr).ptr >> 3) + (ulong)uVar8 + 1 <=
              (srcSegment->ptr).size_) {
            uVar14 = (ulong)uVar8 + 1;
            uVar7 = srcSegment->readLimiter->limit;
            if (uVar14 <= uVar7) {
              srcSegment->readLimiter->limit = uVar7 - uVar14;
              goto LAB_0019b9da;
            }
            (*srcSegment->arena->_vptr_Arena[3])();
          }
          condition = "boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS)";
          iVar6 = 0x7be;
        }
        else {
          iVar6 = *(int *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar8 & 7) * 4);
          uVar16 = (uint)(bVar11 == 6) * 0x40 + iVar6;
          uVar12 = uVar8 >> 3;
          uVar14 = (ulong)uVar12;
          if (srcSegment == (SegmentReader *)0x0) goto LAB_0019bb35;
          uVar7 = uVar16 * uVar14 + 0x3f >> 6 & 0xffffffff;
          if (((long)srcTarget - (long)(srcSegment->ptr).ptr >> 3) + uVar7 <=
              (srcSegment->ptr).size_) {
            pAVar3 = srcSegment->arena;
            pRVar5 = srcSegment->readLimiter;
            if (uVar7 <= pRVar5->limit) {
              pRVar5->limit = pRVar5->limit - uVar7;
              if ((uVar8 & 7) == 0) {
                if (pRVar5->limit < uVar14) {
                  (*pAVar3->_vptr_Arena[3])();
                  iVar6 = 0x7f1;
                  goto LAB_0019bf49;
                }
                pRVar5->limit = pRVar5->limit - uVar14;
              }
LAB_0019bb35:
              uStack_ac = CONCAT13(uStack_ac._3_1_,CONCAT12((byte)uVar8,(ushort)(bVar11 == 6))) &
                          0xff07ffff;
              local_d0 = SUB84(srcSegment,0);
              uStack_cc = (undefined4)((ulong)srcSegment >> 0x20);
              local_a0 = local_d0;
              uStack_9c = uStack_cc;
              uStack_7c = uStack_ac;
              uStack_74 = uStack_a4;
              goto LAB_0019bb7d;
            }
            (*pAVar3->_vptr_Arena[3])();
          }
          condition = "boundsCheck(srcSegment, ptr, wordCount)";
          iVar6 = 0x7e9;
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,iVar6,FAILED,condition,"\"Message contains out-of-bounds list pointer.\"",
                   (char (*) [45])"Message contains out-of-bounds list pointer.");
        break;
      case 2:
switchD_0019b754_caseD_2:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x7fe,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                   (char (*) [24])"Unexpected FAR pointer.");
        break;
      case 3:
switchD_0019b754_caseD_3:
        if (uVar8 == 3) {
          if (canonical) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[52]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x808,FAILED,(char *)0x0,
                       "\"Cannot create a canonical message with a capability\"",
                       (char (*) [52])"Cannot create a canonical message with a capability");
            kj::_::Debug::Fault::~Fault(&f);
          }
          (**srcCapTable->_vptr_CapTableReader)
                    ((Own<capnp::ClientHook> *)&f_8,srcCapTable,
                     (ulong)(pWVar17->field_1).upper32Bits);
          f = f_8;
          kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&f_8);
          if (local_38 == (ClientHook *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                      (&f_8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x813,FAILED,(char *)0x0,"\"Message contained invalid capability pointer.\""
                       ,(char (*) [46])"Message contained invalid capability pointer.");
            kj::_::Debug::Fault::~Fault(&f_8);
          }
          else {
            setCapabilityPointer(dstSegment,dstCapTable,dst,(Own<capnp::ClientHook> *)&f);
          }
          kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&f);
          if (local_38 != (ClientHook *)0x0) {
            pwVar10 = (word *)0x1;
            goto LAB_0019bc1c;
          }
          goto LAB_0019bbfd;
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x803,FAILED,"src->isCapability()","\"Unknown pointer type.\"",
                   (char (*) [22])"Unknown pointer type.");
      }
    }
    else {
      if ((uVar8 & 3) != 2) goto LAB_0019b7a7;
      iVar6 = (*srcSegment->arena->_vptr_Arena[2])();
      srcSegment = (SegmentReader *)CONCAT44(extraout_var,iVar6);
      if (srcSegment != (SegmentReader *)0x0) {
        uVar14 = (srcSegment->ptr).size_;
        uVar8 = (src->offsetAndKind).value;
        uVar7 = (ulong)(uVar8 >> 3);
        if ((long)uVar14 < (long)(ulong)(uVar8 >> 3)) {
          uVar7 = uVar14;
        }
        uVar15 = 2 - (ulong)((uVar8 & 4) == 0);
        if (uVar14 < uVar7 + uVar15) {
LAB_0019bc70:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x23c,FAILED,"boundsCheck(segment, ptr, padWords)",
                     "\"Message contains out-of-bounds far pointer.\"",
                     (char (*) [44])"Message contains out-of-bounds far pointer.");
          goto LAB_0019b8d1;
        }
        pwVar10 = (srcSegment->ptr).ptr;
        pAVar3 = srcSegment->arena;
        uVar4 = srcSegment->readLimiter->limit;
        if (uVar4 < uVar15) {
          (*pAVar3->_vptr_Arena[3])();
          goto LAB_0019bc70;
        }
        pWVar17 = (WirePointer *)(pwVar10 + uVar7);
        src = pWVar17 + 1;
        srcSegment->readLimiter->limit = uVar4 - uVar15;
        if ((uVar8 & 4) != 0) {
          iVar6 = (*pAVar3->_vptr_Arena[2])(pAVar3,(ulong)(pWVar17->field_1).upper32Bits);
          srcSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar6);
          if (srcSegment == (SegmentReader *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x24e,FAILED,"newSegment != nullptr",
                       "\"Message contains double-far pointer to unknown segment.\"",
                       (char (*) [56])"Message contains double-far pointer to unknown segment.");
          }
          else {
            uVar8 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
            if ((uVar8 & 3) == 2) {
              uVar7 = (ulong)(uVar8 >> 3);
              uVar14 = (srcSegment->ptr).size_;
              if ((long)uVar14 < (long)uVar7) {
                uVar7 = uVar14;
              }
              srcTarget = (srcSegment->ptr).ptr + uVar7;
              goto LAB_0019b7a7;
            }
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x252,FAILED,"pad->kind() == WirePointer::FAR",
                       "\"Second word of double-far pad must be far pointer.\"",
                       (char (*) [51])"Second word of double-far pad must be far pointer.");
          }
          goto LAB_0019b8d1;
        }
        uVar8 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
        lVar13 = (long)((int)uVar8 >> 2);
        srcTarget = pwVar10 + uVar14;
        if ((lVar13 < (long)pwVar10 - (long)src >> 3) || ((long)srcTarget - (long)src >> 3 < lVar13)
           ) goto LAB_0019b7b3;
        srcTarget = (word *)(src + lVar13);
        switch(uVar8 & 3) {
        case 1:
          goto switchD_0019b754_caseD_1;
        case 2:
          goto switchD_0019b754_caseD_2;
        case 3:
          goto switchD_0019b754_caseD_3;
        }
        goto switchD_0019b754_caseD_0;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x234,FAILED,"segment != nullptr",
                 "\"Message contains far pointer to unknown segment.\"",
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
LAB_0019b8d1:
    kj::_::Debug::Fault::~Fault(&f);
  }
LAB_0019bbfd:
  if ((dst->field_1).upper32Bits != 0 || (dst->offsetAndKind).value != 0) {
    zeroObject(dstSegment,dstCapTable,dst);
    dst->offsetAndKind = 0;
    dst->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  pwVar10 = (word *)0x0;
LAB_0019bc1c:
  SVar18.value = pwVar10;
  SVar18.segment = dstSegment;
  return SVar18;
}

Assistant:

static SegmentAnd<word*> copyPointer(
      SegmentBuilder* dstSegment, CapTableBuilder* dstCapTable, WirePointer* dst,
      SegmentReader* srcSegment, CapTableReader* srcCapTable, const WirePointer* src,
      const word* srcTarget, int nestingLimit,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    // Deep-copy the object pointed to by src into dst.  It turns out we can't reuse
    // readStructPointer(), etc. because they do type checking whereas here we want to accept any
    // valid pointer.

    if (src->isNull()) {
    useDefault:
      if (!dst->isNull()) {
        zeroObject(dstSegment, dstCapTable, dst);
        zeroMemory(dst);
      }
      return { dstSegment, nullptr };
    }

    const word* ptr;
    KJ_IF_MAYBE(p, WireHelpers::followFars(src, srcTarget, srcSegment)) {
      ptr = p;
    } else {
      goto useDefault;
    }

    switch (src->kind()) {
      case WirePointer::STRUCT:
        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        KJ_REQUIRE(boundsCheck(srcSegment, ptr, src->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer.") {
          goto useDefault;
        }
        return setStructPointer(dstSegment, dstCapTable, dst,
            StructReader(srcSegment, srcCapTable, ptr,
                         reinterpret_cast<const WirePointer*>(ptr + src->structRef.dataSize.get()),
                         src->structRef.dataSize.get() * BITS_PER_WORD,
                         src->structRef.ptrCount.get(),
                         nestingLimit - 1),
            orphanArena, canonical);

      case WirePointer::LIST: {
        ElementSize elementSize = src->listRef.elementSize();

        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        if (elementSize == ElementSize::INLINE_COMPOSITE) {
          auto wordCount = src->listRef.inlineCompositeWordCount();
          const WirePointer* tag = reinterpret_cast<const WirePointer*>(ptr);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                     "Message contains out-of-bounds list pointer.") {
            goto useDefault;
          }

          ptr += POINTER_SIZE_IN_WORDS;

          KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
                     "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
            goto useDefault;
          }

          auto elementCount = tag->inlineCompositeListElementCount();
          auto wordsPerElement = tag->structRef.wordSize() / ELEMENTS;

          KJ_REQUIRE(wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount,
                     "INLINE_COMPOSITE list's elements overrun its word count.") {
            goto useDefault;
          }

          if (wordsPerElement * (ONE * ELEMENTS) == ZERO * WORDS) {
            // Watch out for lists of zero-sized structs, which can claim to be arbitrarily large
            // without having sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr,
                         elementCount, wordsPerElement * BITS_PER_WORD,
                         tag->structRef.dataSize.get() * BITS_PER_WORD,
                         tag->structRef.ptrCount.get(), ElementSize::INLINE_COMPOSITE,
                         nestingLimit - 1),
              orphanArena, canonical);
        } else {
          auto dataSize = dataBitsPerElement(elementSize) * ELEMENTS;
          auto pointerCount = pointersPerElement(elementSize) * ELEMENTS;
          auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;
          auto elementCount = src->listRef.elementCount();
          auto wordCount = roundBitsUpToWords(upgradeBound<uint64_t>(elementCount) * step);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount),
                     "Message contains out-of-bounds list pointer.") {
            goto useDefault;
          }

          if (elementSize == ElementSize::VOID) {
            // Watch out for lists of void, which can claim to be arbitrarily large without having
            // sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr, elementCount, step, dataSize, pointerCount,
                         elementSize, nestingLimit - 1),
              orphanArena, canonical);
        }
      }

      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          goto useDefault;
        }

      case WirePointer::OTHER: {
        KJ_REQUIRE(src->isCapability(), "Unknown pointer type.") {
          goto useDefault;
        }

        if (canonical) {
          KJ_FAIL_REQUIRE("Cannot create a canonical message with a capability") {
            break;
          }
        }
#if !CAPNP_LITE
        KJ_IF_MAYBE(cap, srcCapTable->extractCap(src->capRef.index.get())) {
          setCapabilityPointer(dstSegment, dstCapTable, dst, kj::mv(*cap));
          // Return dummy non-null pointer so OrphanBuilder doesn't end up null.
          return { dstSegment, reinterpret_cast<word*>(1) };
        } else {
#endif  // !CAPNP_LITE
          KJ_FAIL_REQUIRE("Message contained invalid capability pointer.") {
            goto useDefault;
          }
#if !CAPNP_LITE
        }
#endif  // !CAPNP_LITE
      }
    }

    KJ_UNREACHABLE;
  }